

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O1

void MiniScript::AllowLineBreak(Lexer *tokens)

{
  long *plVar1;
  LexerStorage *pLVar2;
  ListStorage<MiniScript::Token> *pLVar3;
  bool bVar4;
  Token local_60;
  Token local_40;
  
  Lexer::Peek(&local_60,tokens);
  if (local_60.type == EOL) {
    do {
      pLVar2 = tokens->ls;
      bVar4 = true;
      if (pLVar2 != (LexerStorage *)0x0) {
        if (pLVar2->positionB < pLVar2->inputLengthB) {
          bVar4 = false;
        }
        else {
          pLVar3 = (pLVar2->pending).ls;
          if (pLVar3 != (ListStorage<MiniScript::Token> *)0x0) {
            bVar4 = (pLVar3->super_SimpleVector<MiniScript::Token>).mQtyItems == 0;
          }
        }
      }
      if ((local_60.text.ss != (StringStorage *)0x0) && (local_60.text.isTemp == false)) {
        plVar1 = &((local_60.text.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_60.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_60.text.ss = (StringStorage *)0x0;
      }
      if (bVar4) {
        return;
      }
      Lexer::Dequeue(&local_40,tokens);
      if ((local_40.text.ss != (StringStorage *)0x0) && (local_40.text.isTemp == false)) {
        plVar1 = &((local_40.text.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_40.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_40.text.ss = (StringStorage *)0x0;
      }
      Lexer::Peek(&local_60,tokens);
    } while (local_60.type == EOL);
  }
  if ((local_60.text.ss != (StringStorage *)0x0) && (local_60.text.isTemp == false)) {
    plVar1 = &((local_60.text.ss)->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((local_60.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
  }
  return;
}

Assistant:

static void AllowLineBreak(Lexer tokens) {
		while (tokens.Peek().type == Token::Type::EOL && not tokens.atEnd()) tokens.Dequeue();
	}